

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_layer<ncnn::Slice>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *a,int top_blob_count,
              vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_shapes,float epsilon,
              _func_void_Slice_ptr *func)

{
  pointer pMVar1;
  undefined8 uVar2;
  int iVar3;
  Slice *this;
  Option *opt_00;
  size_t i;
  ulong uVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *__arg;
  size_t i_1;
  long lVar5;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> a4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> b;
  Mat a_bf16;
  ModelBinFromMatArray mb;
  
  opt_00 = _opt;
  __arg = a;
  this = (Slice *)ncnn::create_layer(typeindex);
  if (func != (_func_void_Slice_ptr *)0x0) {
    (*func)(this);
  }
  opt.use_int8_arithmetic = _opt->use_int8_arithmetic;
  opt.use_packing_layout = _opt->use_packing_layout;
  opt.use_shader_pack8 = _opt->use_shader_pack8;
  opt.use_bf16_storage = _opt->use_bf16_storage;
  opt._36_4_ = *(undefined4 *)&_opt->field_0x24;
  opt.lightmode = _opt->lightmode;
  opt._1_3_ = *(undefined3 *)&_opt->field_0x1;
  opt.num_threads = _opt->num_threads;
  opt.blob_allocator._0_4_ = *(undefined4 *)&_opt->blob_allocator;
  opt.blob_allocator._4_4_ = *(undefined4 *)((long)&_opt->blob_allocator + 4);
  opt.workspace_allocator = _opt->workspace_allocator;
  opt.use_winograd_convolution = _opt->use_winograd_convolution;
  opt.use_sgemm_convolution = _opt->use_sgemm_convolution;
  opt.use_int8_inference = _opt->use_int8_inference;
  opt.use_vulkan_compute = _opt->use_vulkan_compute;
  opt.use_fp16_packed = _opt->use_fp16_packed;
  opt.use_fp16_storage = _opt->use_fp16_storage;
  opt.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  opt.use_int8_storage = _opt->use_int8_storage;
  if ((this->super_Layer).support_vulkan == false) {
    opt.use_vulkan_compute = false;
  }
  if ((this->super_Layer).support_packing == false) {
    opt.use_packing_layout = false;
  }
  if ((this->super_Layer).support_bf16_storage == false) {
    opt.use_bf16_storage = false;
  }
  uVar2 = opt._32_8_;
  if (opt.use_int8_inference == true) {
    opt.use_bf16_storage = false;
    opt.use_int8_arithmetic = SUB81(uVar2,0);
    opt.use_packing_layout = false;
  }
  if ((top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (&(this->super_Layer).bottom_shapes,a);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (&(this->super_Layer).top_shapes,top_shapes);
  }
  (*(this->super_Layer)._vptr_Layer[2])(this,pd);
  if (((this->super_Layer).one_blob_only == true) &&
     ((long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start != 0x40)) {
    fwrite("layer with one_blob_only but consume multiple inputs\n",0x35,1,_stderr);
    (*(this->super_Layer)._vptr_Layer[1])(this);
    iVar3 = -1;
  }
  else {
    ncnn::ModelBinFromMatArray::ModelBinFromMatArray
              (&mb,(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start);
    (*(this->super_Layer)._vptr_Layer[3])(this,&mb);
    (*(this->super_Layer)._vptr_Layer[4])(this,&opt);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&b,(long)top_blob_count,(allocator_type *)&a_bf16);
    if ((this->super_Layer).support_inplace == true) {
      lVar5 = 0;
      for (uVar4 = 0;
          pMVar1 = (a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          uVar4 < (ulong)((long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 6);
          uVar4 = uVar4 + 1) {
        ncnn::Mat::clone(&a_bf16,(__fn *)((long)&pMVar1->data + lVar5),(void *)0x0,(int)opt_00,__arg
                        );
        ncnn::Mat::operator=
                  ((Mat *)((long)&(b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),&a_bf16)
        ;
        ncnn::Mat::~Mat(&a_bf16);
        lVar5 = lVar5 + 0x40;
      }
      ncnn::Layer::forward_inplace((Layer *)this,&b,&opt);
    }
    else {
      opt_00 = &opt;
      ncnn::Slice::forward(this,a,&b,opt_00);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&c,(long)top_blob_count,(allocator_type *)&a_bf16);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&a4,(long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 6,(allocator_type *)&a_bf16);
    if (opt.use_packing_layout == true) {
      lVar5 = 0;
      for (uVar4 = 0;
          pMVar1 = (a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          uVar4 < (ulong)((long)(a->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 6);
          uVar4 = uVar4 + 1) {
        opt_00 = &opt;
        ncnn::convert_packing
                  ((Mat *)((long)&pMVar1->data + lVar5),
                   (Mat *)((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),4,&opt);
        lVar5 = lVar5 + 0x40;
      }
    }
    else {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(&a4,a);
    }
    if (opt.use_bf16_storage == true) {
      lVar5 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                .super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
        a_bf16.elemsize._0_4_ = 0;
        a_bf16._20_8_ = 0;
        a_bf16.data = (void *)0x0;
        a_bf16.refcount._0_4_ = 0;
        a_bf16.refcount._4_4_ = 0;
        a_bf16.h = 0;
        a_bf16.c = 0;
        a_bf16.cstep = 0;
        a_bf16.allocator = (Allocator *)0x0;
        a_bf16.dims = 0;
        a_bf16.w = 0;
        ncnn::cast_float32_to_bfloat16
                  ((Mat *)((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),&a_bf16,
                   &opt);
        ncnn::Mat::operator=
                  ((Mat *)((long)&(a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),&a_bf16)
        ;
        ncnn::Mat::~Mat(&a_bf16);
        lVar5 = lVar5 + 0x40;
      }
    }
    if ((this->super_Layer).support_inplace == true) {
      lVar5 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)a4.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                .super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
        ncnn::Mat::clone(&a_bf16,(__fn *)((long)&(a4.
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data +
                                         lVar5),(void *)0x0,(int)opt_00,__arg);
        ncnn::Mat::operator=
                  ((Mat *)((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),&a_bf16)
        ;
        ncnn::Mat::~Mat(&a_bf16);
        lVar5 = lVar5 + 0x40;
      }
      (*(this->super_Layer)._vptr_Layer[8])(this,&c,&opt);
    }
    else {
      (*(this->super_Layer)._vptr_Layer[6])(this,&a4,&c,&opt);
    }
    if (opt.use_bf16_storage == true) {
      lVar5 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
        a_bf16.elemsize._0_4_ = 0;
        a_bf16._20_8_ = 0;
        a_bf16.data = (void *)0x0;
        a_bf16.refcount._0_4_ = 0;
        a_bf16.refcount._4_4_ = 0;
        a_bf16.h = 0;
        a_bf16.c = 0;
        a_bf16.cstep = 0;
        a_bf16.allocator = (Allocator *)0x0;
        a_bf16.dims = 0;
        a_bf16.w = 0;
        ncnn::cast_bfloat16_to_float32
                  ((Mat *)((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),&a_bf16,
                   &opt);
        ncnn::Mat::operator=
                  ((Mat *)((long)&(c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->data + lVar5),&a_bf16)
        ;
        ncnn::Mat::~Mat(&a_bf16);
        lVar5 = lVar5 + 0x40;
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&a4);
    (*(this->super_Layer)._vptr_Layer[5])(this,&opt);
    (*(this->super_Layer)._vptr_Layer[1])(this);
    if ((long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start >> 6 ==
        (long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)c.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start >> 6) {
      lVar5 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)b.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
        iVar3 = CompareMat((Mat *)((long)&(b.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->data + lVar5)
                           ,(Mat *)((long)&(c.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data + lVar5
                                   ),epsilon);
        if (iVar3 != 0) {
          fprintf(_stderr,"output blob %zu not match\n",uVar4);
          goto LAB_00113fa3;
        }
        lVar5 = lVar5 + 0x40;
      }
      iVar3 = 0;
      if ((top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (top_shapes->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar3 = test_layer<ncnn::Slice>(typeindex,pd,weights,&opt,a,top_blob_count,&b,epsilon,func);
      }
    }
    else {
      fprintf(_stderr,"output blob count not match %zu %zu\n");
LAB_00113fa3:
      fwrite("test_layer failed cpu\n",0x16,1,_stderr);
      iVar3 = -1;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&c);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&b);
    ncnn::ModelBin::~ModelBin(&mb.super_ModelBin);
  }
  return iVar3;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const std::vector<ncnn::Mat>& a, int top_blob_count, const std::vector<ncnn::Mat>& top_shapes = std::vector<ncnn::Mat>(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);

    if (func)
    {
        (*func)((T*)op);
    }

    ncnn::Option opt = _opt;

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (!top_shapes.empty())
    {
        op->bottom_shapes = a;
        op->top_shapes = top_shapes;
    }

    op->load_param(pd);

    if (op->one_blob_only && a.size() != 1)
    {
        fprintf(stderr, "layer with one_blob_only but consume multiple inputs\n");
        delete op;
        return -1;
    }

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    std::vector<ncnn::Mat> b(top_blob_count);
    if (op->support_inplace)
    {
        for (size_t i=0; i<a.size(); i++)
        {
            b[i] = a[i].clone();
        }

        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    std::vector<ncnn::Mat> c(top_blob_count);
    {
        std::vector<ncnn::Mat> a4(a.size());
        if (opt.use_packing_layout)
        {
            for (size_t i=0; i<a.size(); i++)
            {
                ncnn::convert_packing(a[i], a4[i], 4, opt);
            }
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            for (size_t i=0; i<a4.size(); i++)
            {
                ncnn::Mat a_bf16;
                ncnn::cast_float32_to_bfloat16(a4[i], a_bf16, opt);
                a4[i] = a_bf16;
            }
        }

        if (op->support_inplace)
        {
            for (size_t i=0; i<a4.size(); i++)
            {
                c[i] = a4[i].clone();
            }

            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            for (size_t i=0; i<c.size(); i++)
            {
                ncnn::Mat c_fp32;
                ncnn::cast_bfloat16_to_float32(c[i], c_fp32, opt);
                c[i] = c_fp32;
            }
        }
    }

#if NCNN_VULKAN
    std::vector<ncnn::Mat> d(top_blob_count);
    if (opt.use_vulkan_compute)
    {
        // pack
        std::vector<ncnn::Mat> a4(a.size());
        for (size_t i=0; i<a.size(); i++)
        {
            if (opt.use_shader_pack8)
            {
                ncnn::convert_packing(a[i], a4[i], 8, opt);
                if (a4[i].elempack == 1)
                    ncnn::convert_packing(a[i], a4[i], 4, opt);
            }
            else
                ncnn::convert_packing(a[i], a4[i], 4, opt);
        }

        // fp16
        std::vector<ncnn::Mat> a4_fp16(a4.size());
        for (size_t i=0; i<a4.size(); i++)
        {
            if (opt.use_fp16_storage || ((a4[i].elempack == 4 || a4[i].elempack == 8) && opt.use_fp16_packed))
            {
                ncnn::cast_float32_to_float16(a4[i], a4_fp16[i], opt);
            }
            else
            {
                a4_fp16[i] = a4[i];
            }
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        std::vector<ncnn::VkMat> a4_fp16_gpu(a4_fp16.size());
        for (size_t i=0; i<a4_fp16_gpu.size(); i++)
        {
            cmd.record_upload(a4_fp16[i], a4_fp16_gpu[i], opt);
        }

        std::vector<ncnn::VkMat> d4_fp16_gpu(top_blob_count);
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        for (size_t i=0; i<d4_fp16_gpu.size(); i++)
        {
            cmd.record_download(d4_fp16_gpu[i], d[i], opt);
        }

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shapes.empty())
        return test_layer<T>(typeindex, pd, weights, opt, a, top_blob_count, b, epsilon, func);

    return 0;
}